

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

int __thiscall Console::step(Console *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar1 = CPU::execute(this->cpu);
  iVar1 = iVar1 * 3;
  iVar2 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    iVar2 = PPU::execute(this->ppu);
  }
  return iVar2;
}

Assistant:

int Console::step() {
    int frame = 0;
    int cpu_cycles = cpu->execute();
    for (int i = 0; i < (3*cpu_cycles); ++i) {
    	frame = ppu->execute();
    }
    return frame;
}